

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

int cueify_device_read_cdtext_unportable(cueify_device_private *d,cueify_cdtext_private *t)

{
  int iVar1;
  uint8_t local_90b8 [8];
  uint8_t data [36868];
  undefined1 local_a8 [8];
  request_sense sense;
  scsi_read_toc *scsi_cmd;
  cdrom_generic_command gpcmd;
  cueify_cdtext_private *t_local;
  cueify_device_private *d_local;
  
  gpcmd.field_8 = (anon_union_8_2_fd3c5b0f_for_cdrom_generic_command_8)t;
  memset(&scsi_cmd,0,0x40);
  sense.asb._38_8_ = &scsi_cmd;
  scsi_cmd._2_1_ = scsi_cmd._2_1_ | 5;
  scsi_cmd._7_1_ = 0x90;
  gpcmd.cmd[0] = '\x04';
  scsi_cmd._0_1_ = 0x43;
  gpcmd._8_8_ = local_90b8;
  gpcmd.buffer._0_4_ = 0x9004;
  gpcmd._24_8_ = local_a8;
  gpcmd.sense._0_1_ = 2;
  gpcmd.data_direction = 'P';
  gpcmd._41_3_ = 0xc3;
  iVar1 = ioctl(d->handle,0x5393,&scsi_cmd);
  if (iVar1 < 0) {
    d_local._4_4_ = 2;
  }
  else {
    d_local._4_4_ =
         cueify_cdtext_deserialize((cueify_cdtext *)gpcmd.field_8.unused,local_90b8,0x9004);
  }
  return d_local._4_4_;
}

Assistant:

int cueify_device_read_cdtext_unportable(cueify_device_private *d,
					 cueify_cdtext_private *t) {
    struct cdrom_generic_command gpcmd;
    struct scsi_read_toc *scsi_cmd;
    struct request_sense sense;
    /* At most 2048 descriptors at 18 bytes a piece, plus 4 bytes header. */
    uint8_t data[2048 * 18 + 4];

    memset(&gpcmd, 0, sizeof(gpcmd));

    scsi_cmd = (struct scsi_read_toc *)&gpcmd.cmd;
    scsi_cmd->format |= 0x05;  /* 0101b = CD-TEXT */
    scsi_cmd->data_len[0] = (sizeof(data) >> 8) & 0xFF;
    scsi_cmd->data_len[1] = sizeof(data) & 0xFF;
    scsi_cmd->op_code = GPCMD_READ_TOC_PMA_ATIP;

    gpcmd.buffer = data;
    gpcmd.buflen = sizeof(data);
    gpcmd.sense = &sense;
    gpcmd.data_direction = CGC_DATA_READ;
    gpcmd.timeout = 50000;

    if (ioctl(d->handle, CDROM_SEND_PACKET, &gpcmd) < 0) {
	return CUEIFY_ERR_INTERNAL;
    }

    /* We serialize to the format of the TOC response for a reason... */
    return cueify_cdtext_deserialize((cueify_cdtext *)t,
				     data, sizeof(data));
}